

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>::dx
          (FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_> *this,int i)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  FadExpr<FadFuncAtan<Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double dVar7;
  
  pFVar4 = this->left_;
  pFVar5 = this->right_;
  pdVar6 = &(pFVar4->fadexpr_).expr_.defaultVal;
  if ((pFVar4->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar6 = (pFVar4->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  __x = (pFVar4->fadexpr_).expr_.val_;
  dVar1 = *pdVar6;
  pdVar6 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar6 = (pFVar5->dx_).ptr_to_data + i;
  }
  dVar2 = *pdVar6;
  dVar3 = pFVar5->val_;
  dVar7 = atan(__x);
  return dVar7 * dVar2 + (dVar1 / (__x * __x + 1.0)) * dVar3;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}